

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMvIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCRayQueryContext *pRVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  size_t k;
  bool bVar26;
  ushort uVar27;
  uint uVar28;
  ushort uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [64];
  ulong *puVar33;
  NodeRef root;
  long lVar34;
  undefined4 uVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  undefined1 auVar39 [32];
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  int iVar77;
  int iVar85;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar86 [64];
  undefined1 in_ZMM2 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  Precalculations local_a7d9;
  RayK<16> *local_a7d8;
  ulong local_a7d0;
  RayQueryContext *local_a7c8;
  RayK<16> *local_a7c0;
  uint local_a7b8;
  uint local_a7b4;
  undefined1 (*local_a7b0) [32];
  RTCFilterFunctionNArguments local_a7a8;
  BVH *local_a778;
  Intersectors *local_a770;
  ulong local_a768;
  ulong local_a760;
  long local_a758;
  undefined8 local_a750;
  undefined8 uStack_a748;
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  RTCHitN local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a400;
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  uint local_a100;
  uint uStack_a0fc;
  uint uStack_a0f8;
  uint uStack_a0f4;
  uint uStack_a0f0;
  uint uStack_a0ec;
  uint uStack_a0e8;
  uint uStack_a0e4;
  uint uStack_a0e0;
  uint uStack_a0dc;
  uint uStack_a0d8;
  uint uStack_a0d4;
  uint uStack_a0d0;
  uint uStack_a0cc;
  uint uStack_a0c8;
  uint uStack_a0c4;
  uint local_a0c0;
  uint uStack_a0bc;
  uint uStack_a0b8;
  uint uStack_a0b4;
  uint uStack_a0b0;
  uint uStack_a0ac;
  uint uStack_a0a8;
  uint uStack_a0a4;
  uint uStack_a0a0;
  uint uStack_a09c;
  uint uStack_a098;
  uint uStack_a094;
  uint uStack_a090;
  uint uStack_a08c;
  uint uStack_a088;
  uint uStack_a084;
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a778 = (BVH *)This->ptr;
  local_9e48 = (local_a778->root).ptr;
  if (local_9e48 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar40 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar37 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar86,5);
      uVar30 = vpcmpeqd_avx512f(auVar40,(undefined1  [64])valid_i->field_0);
      uVar37 = uVar37 & uVar30;
      if ((ushort)uVar37 != 0) {
        local_a400._0_8_ = *(undefined8 *)ray;
        local_a400._8_8_ = *(undefined8 *)(ray + 8);
        local_a400._16_8_ = *(undefined8 *)(ray + 0x10);
        local_a400._24_8_ = *(undefined8 *)(ray + 0x18);
        local_a400._32_8_ = *(undefined8 *)(ray + 0x20);
        local_a400._40_8_ = *(undefined8 *)(ray + 0x28);
        local_a400._48_8_ = *(undefined8 *)(ray + 0x30);
        local_a400._56_8_ = *(undefined8 *)(ray + 0x38);
        local_a400._64_8_ = *(undefined8 *)(ray + 0x40);
        local_a400._72_8_ = *(undefined8 *)(ray + 0x48);
        local_a400._80_8_ = *(undefined8 *)(ray + 0x50);
        local_a400._88_8_ = *(undefined8 *)(ray + 0x58);
        local_a400._96_8_ = *(undefined8 *)(ray + 0x60);
        local_a400._104_8_ = *(undefined8 *)(ray + 0x68);
        local_a400._112_8_ = *(undefined8 *)(ray + 0x70);
        local_a400._120_8_ = *(undefined8 *)(ray + 0x78);
        local_a400._128_8_ = *(undefined8 *)(ray + 0x80);
        local_a400._136_8_ = *(undefined8 *)(ray + 0x88);
        local_a400._144_8_ = *(undefined8 *)(ray + 0x90);
        local_a400._152_8_ = *(undefined8 *)(ray + 0x98);
        local_a400._160_8_ = *(undefined8 *)(ray + 0xa0);
        local_a400._168_8_ = *(undefined8 *)(ray + 0xa8);
        local_a400._176_8_ = *(undefined8 *)(ray + 0xb0);
        local_a400._184_8_ = *(undefined8 *)(ray + 0xb8);
        local_a340 = *(undefined1 (*) [64])(ray + 0x100);
        local_a300 = *(undefined1 (*) [64])(ray + 0x140);
        local_a2c0 = *(undefined1 (*) [64])(ray + 0x180);
        auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar40 = vandps_avx512dq(local_a340,auVar41);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar30 = vcmpps_avx512f(auVar40,auVar42,1);
        auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar40 = vdivps_avx512f(auVar43,local_a340);
        auVar44 = vdivps_avx512f(auVar43,local_a300);
        auVar45 = vandps_avx512dq(local_a300,auVar41);
        uVar20 = vcmpps_avx512f(auVar45,auVar42,1);
        auVar45 = vandps_avx512dq(local_a2c0,auVar41);
        auVar46 = vdivps_avx512f(auVar43,local_a2c0);
        uVar21 = vcmpps_avx512f(auVar45,auVar42,1);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
        bVar26 = (bool)((byte)uVar30 & 1);
        iVar38 = auVar42._0_4_;
        local_a280._0_4_ = (uint)bVar26 * iVar38 | (uint)!bVar26 * auVar40._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        iVar71 = auVar42._4_4_;
        local_a280._4_4_ = (uint)bVar26 * iVar71 | (uint)!bVar26 * auVar40._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        iVar72 = auVar42._8_4_;
        local_a280._8_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar40._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        iVar73 = auVar42._12_4_;
        local_a280._12_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar40._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        iVar74 = auVar42._16_4_;
        local_a280._16_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar40._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        iVar75 = auVar42._20_4_;
        local_a280._20_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar40._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        iVar76 = auVar42._24_4_;
        local_a280._24_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar40._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        iVar77 = auVar42._28_4_;
        local_a280._28_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar40._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        iVar78 = auVar42._32_4_;
        local_a280._32_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar40._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        iVar79 = auVar42._36_4_;
        local_a280._36_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar40._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        iVar80 = auVar42._40_4_;
        local_a280._40_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar40._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        iVar81 = auVar42._44_4_;
        local_a280._44_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar40._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        iVar82 = auVar42._48_4_;
        local_a280._48_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar40._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        iVar83 = auVar42._52_4_;
        local_a280._52_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar40._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        iVar84 = auVar42._56_4_;
        iVar85 = auVar42._60_4_;
        local_a280._56_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar40._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        local_a280._60_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar40._60_4_;
        bVar26 = (bool)((byte)uVar20 & 1);
        local_a240._0_4_ = (uint)bVar26 * iVar38 | (uint)!bVar26 * auVar44._0_4_;
        bVar26 = (bool)((byte)(uVar20 >> 1) & 1);
        local_a240._4_4_ = (uint)bVar26 * iVar71 | (uint)!bVar26 * auVar44._4_4_;
        bVar26 = (bool)((byte)(uVar20 >> 2) & 1);
        local_a240._8_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar44._8_4_;
        bVar26 = (bool)((byte)(uVar20 >> 3) & 1);
        local_a240._12_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar44._12_4_;
        bVar26 = (bool)((byte)(uVar20 >> 4) & 1);
        local_a240._16_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar44._16_4_;
        bVar26 = (bool)((byte)(uVar20 >> 5) & 1);
        local_a240._20_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar44._20_4_;
        bVar26 = (bool)((byte)(uVar20 >> 6) & 1);
        local_a240._24_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar44._24_4_;
        bVar26 = (bool)((byte)(uVar20 >> 7) & 1);
        local_a240._28_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar44._28_4_;
        bVar26 = (bool)((byte)(uVar20 >> 8) & 1);
        local_a240._32_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar44._32_4_;
        bVar26 = (bool)((byte)(uVar20 >> 9) & 1);
        local_a240._36_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar44._36_4_;
        bVar26 = (bool)((byte)(uVar20 >> 10) & 1);
        local_a240._40_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar44._40_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xb) & 1);
        local_a240._44_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar44._44_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xc) & 1);
        local_a240._48_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar44._48_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xd) & 1);
        local_a240._52_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar44._52_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xe) & 1);
        local_a240._56_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar44._56_4_;
        bVar26 = SUB81(uVar20 >> 0xf,0);
        local_a240._60_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar44._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        local_a200._0_4_ = (uint)bVar26 * iVar38 | (uint)!bVar26 * auVar46._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        local_a200._4_4_ = (uint)bVar26 * iVar71 | (uint)!bVar26 * auVar46._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        local_a200._8_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar46._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        local_a200._12_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar46._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        local_a200._16_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar46._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        local_a200._20_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar46._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        local_a200._24_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar46._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        local_a200._28_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar46._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        local_a200._32_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar46._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        local_a200._36_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar46._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        local_a200._40_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar46._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        local_a200._44_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar46._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        local_a200._48_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar46._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        local_a200._52_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar46._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        local_a200._56_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar46._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        local_a200._60_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar46._60_4_;
        uVar30 = vcmpps_avx512f(local_a280,auVar86,1);
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0x20));
        auVar40._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar42._4_4_;
        auVar40._0_4_ = (uint)((byte)uVar30 & 1) * auVar42._0_4_;
        auVar40._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar42._8_4_;
        auVar40._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar42._12_4_;
        auVar40._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar42._16_4_;
        auVar40._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar42._20_4_;
        auVar40._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar42._24_4_;
        auVar40._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar42._28_4_;
        auVar40._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar42._32_4_;
        auVar40._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar42._36_4_;
        auVar40._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar42._40_4_;
        auVar40._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar42._44_4_;
        auVar40._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar42._48_4_;
        auVar40._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar42._52_4_;
        auVar40._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar42._56_4_;
        auVar40._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar42._60_4_;
        local_a1c0 = vmovdqa64_avx512f(auVar40);
        uVar30 = vcmpps_avx512f(local_a240,auVar86,5);
        auVar40 = vpbroadcastd_avx512f(ZEXT416(0x60));
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0x40));
        bVar26 = (bool)((byte)uVar30 & 1);
        auVar44._0_4_ = (uint)bVar26 * auVar42._0_4_ | (uint)!bVar26 * auVar40._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar26 * auVar42._4_4_ | (uint)!bVar26 * auVar40._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar26 * auVar42._8_4_ | (uint)!bVar26 * auVar40._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar26 * auVar42._12_4_ | (uint)!bVar26 * auVar40._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar26 * auVar42._16_4_ | (uint)!bVar26 * auVar40._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar26 * auVar42._20_4_ | (uint)!bVar26 * auVar40._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar26 * auVar42._24_4_ | (uint)!bVar26 * auVar40._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar26 * auVar42._28_4_ | (uint)!bVar26 * auVar40._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar44._32_4_ = (uint)bVar26 * auVar42._32_4_ | (uint)!bVar26 * auVar40._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar44._36_4_ = (uint)bVar26 * auVar42._36_4_ | (uint)!bVar26 * auVar40._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar44._40_4_ = (uint)bVar26 * auVar42._40_4_ | (uint)!bVar26 * auVar40._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar44._44_4_ = (uint)bVar26 * auVar42._44_4_ | (uint)!bVar26 * auVar40._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar44._48_4_ = (uint)bVar26 * auVar42._48_4_ | (uint)!bVar26 * auVar40._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar44._52_4_ = (uint)bVar26 * auVar42._52_4_ | (uint)!bVar26 * auVar40._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar44._56_4_ = (uint)bVar26 * auVar42._56_4_ | (uint)!bVar26 * auVar40._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        auVar44._60_4_ = (uint)bVar26 * auVar42._60_4_ | (uint)!bVar26 * auVar40._60_4_;
        local_a180 = vmovdqa64_avx512f(auVar44);
        uVar30 = vcmpps_avx512f(local_a200,auVar86,5);
        auVar40 = vpbroadcastd_avx512f(ZEXT416(0xa0));
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0x80));
        bVar26 = (bool)((byte)uVar30 & 1);
        auVar45._0_4_ = (uint)bVar26 * auVar42._0_4_ | (uint)!bVar26 * auVar40._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar26 * auVar42._4_4_ | (uint)!bVar26 * auVar40._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar26 * auVar42._8_4_ | (uint)!bVar26 * auVar40._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar26 * auVar42._12_4_ | (uint)!bVar26 * auVar40._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar26 * auVar42._16_4_ | (uint)!bVar26 * auVar40._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar26 * auVar42._20_4_ | (uint)!bVar26 * auVar40._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar26 * auVar42._24_4_ | (uint)!bVar26 * auVar40._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar45._28_4_ = (uint)bVar26 * auVar42._28_4_ | (uint)!bVar26 * auVar40._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar45._32_4_ = (uint)bVar26 * auVar42._32_4_ | (uint)!bVar26 * auVar40._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar45._36_4_ = (uint)bVar26 * auVar42._36_4_ | (uint)!bVar26 * auVar40._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar45._40_4_ = (uint)bVar26 * auVar42._40_4_ | (uint)!bVar26 * auVar40._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar45._44_4_ = (uint)bVar26 * auVar42._44_4_ | (uint)!bVar26 * auVar40._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar45._48_4_ = (uint)bVar26 * auVar42._48_4_ | (uint)!bVar26 * auVar40._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar45._52_4_ = (uint)bVar26 * auVar42._52_4_ | (uint)!bVar26 * auVar40._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar45._56_4_ = (uint)bVar26 * auVar42._56_4_ | (uint)!bVar26 * auVar40._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        auVar45._60_4_ = (uint)bVar26 * auVar42._60_4_ | (uint)!bVar26 * auVar40._60_4_;
        local_a140 = vmovdqa64_avx512f(auVar45);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar40 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar86);
        bVar26 = (bool)((byte)uVar37 & 1);
        local_a100 = (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * auVar42._0_4_;
        bVar26 = (bool)((byte)(uVar37 >> 1) & 1);
        uStack_a0fc = (uint)bVar26 * auVar40._4_4_ | (uint)!bVar26 * auVar42._4_4_;
        bVar26 = (bool)((byte)(uVar37 >> 2) & 1);
        uStack_a0f8 = (uint)bVar26 * auVar40._8_4_ | (uint)!bVar26 * auVar42._8_4_;
        bVar26 = (bool)((byte)(uVar37 >> 3) & 1);
        uStack_a0f4 = (uint)bVar26 * auVar40._12_4_ | (uint)!bVar26 * auVar42._12_4_;
        bVar26 = (bool)((byte)(uVar37 >> 4) & 1);
        uStack_a0f0 = (uint)bVar26 * auVar40._16_4_ | (uint)!bVar26 * auVar42._16_4_;
        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
        uStack_a0ec = (uint)bVar26 * auVar40._20_4_ | (uint)!bVar26 * auVar42._20_4_;
        bVar26 = (bool)((byte)(uVar37 >> 6) & 1);
        uStack_a0e8 = (uint)bVar26 * auVar40._24_4_ | (uint)!bVar26 * auVar42._24_4_;
        bVar26 = (bool)((byte)(uVar37 >> 7) & 1);
        uStack_a0e4 = (uint)bVar26 * auVar40._28_4_ | (uint)!bVar26 * auVar42._28_4_;
        bVar11 = (byte)(uVar37 >> 8);
        bVar26 = (bool)(bVar11 & 1);
        uStack_a0e0 = (uint)bVar26 * auVar40._32_4_ | (uint)!bVar26 * auVar42._32_4_;
        bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
        uStack_a0dc = (uint)bVar26 * auVar40._36_4_ | (uint)!bVar26 * auVar42._36_4_;
        bVar26 = (bool)((byte)(uVar37 >> 10) & 1);
        uStack_a0d8 = (uint)bVar26 * auVar40._40_4_ | (uint)!bVar26 * auVar42._40_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xb) & 1);
        uStack_a0d4 = (uint)bVar26 * auVar40._44_4_ | (uint)!bVar26 * auVar42._44_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xc) & 1);
        uStack_a0d0 = (uint)bVar26 * auVar40._48_4_ | (uint)!bVar26 * auVar42._48_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xd) & 1);
        uStack_a0cc = (uint)bVar26 * auVar40._52_4_ | (uint)!bVar26 * auVar42._52_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xe) & 1);
        uStack_a0c8 = (uint)bVar26 * auVar40._56_4_ | (uint)!bVar26 * auVar42._56_4_;
        bVar26 = SUB81(uVar37 >> 0xf,0);
        uStack_a0c4 = (uint)bVar26 * auVar40._60_4_ | (uint)!bVar26 * auVar42._60_4_;
        auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        local_a7b8 = (uint)uVar37;
        auVar86 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar86);
        bVar26 = (bool)((byte)uVar37 & 1);
        local_a0c0 = (uint)bVar26 * auVar86._0_4_ | (uint)!bVar26 * auVar40._0_4_;
        bVar26 = (bool)((byte)(uVar37 >> 1) & 1);
        uStack_a0bc = (uint)bVar26 * auVar86._4_4_ | (uint)!bVar26 * auVar40._4_4_;
        bVar26 = (bool)((byte)(uVar37 >> 2) & 1);
        uStack_a0b8 = (uint)bVar26 * auVar86._8_4_ | (uint)!bVar26 * auVar40._8_4_;
        bVar26 = (bool)((byte)(uVar37 >> 3) & 1);
        uStack_a0b4 = (uint)bVar26 * auVar86._12_4_ | (uint)!bVar26 * auVar40._12_4_;
        bVar26 = (bool)((byte)(uVar37 >> 4) & 1);
        uStack_a0b0 = (uint)bVar26 * auVar86._16_4_ | (uint)!bVar26 * auVar40._16_4_;
        bVar26 = (bool)((byte)(uVar37 >> 5) & 1);
        uStack_a0ac = (uint)bVar26 * auVar86._20_4_ | (uint)!bVar26 * auVar40._20_4_;
        bVar26 = (bool)((byte)(uVar37 >> 6) & 1);
        uStack_a0a8 = (uint)bVar26 * auVar86._24_4_ | (uint)!bVar26 * auVar40._24_4_;
        bVar26 = (bool)((byte)(uVar37 >> 7) & 1);
        uStack_a0a4 = (uint)bVar26 * auVar86._28_4_ | (uint)!bVar26 * auVar40._28_4_;
        bVar26 = (bool)(bVar11 & 1);
        uStack_a0a0 = (uint)bVar26 * auVar86._32_4_ | (uint)!bVar26 * auVar40._32_4_;
        bVar26 = (bool)((byte)(uVar37 >> 9) & 1);
        uStack_a09c = (uint)bVar26 * auVar86._36_4_ | (uint)!bVar26 * auVar40._36_4_;
        bVar26 = (bool)((byte)(uVar37 >> 10) & 1);
        uStack_a098 = (uint)bVar26 * auVar86._40_4_ | (uint)!bVar26 * auVar40._40_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xb) & 1);
        uStack_a094 = (uint)bVar26 * auVar86._44_4_ | (uint)!bVar26 * auVar40._44_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xc) & 1);
        uStack_a090 = (uint)bVar26 * auVar86._48_4_ | (uint)!bVar26 * auVar40._48_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xd) & 1);
        uStack_a08c = (uint)bVar26 * auVar86._52_4_ | (uint)!bVar26 * auVar40._52_4_;
        bVar26 = (bool)((byte)(uVar37 >> 0xe) & 1);
        uStack_a088 = (uint)bVar26 * auVar86._56_4_ | (uint)!bVar26 * auVar40._56_4_;
        bVar26 = SUB81(uVar37 >> 0xf,0);
        uStack_a084 = (uint)bVar26 * auVar86._60_4_ | (uint)!bVar26 * auVar40._60_4_;
        uVar36 = (uint)(ushort)~(ushort)uVar37;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar37 = 0xe;
        }
        else {
          uVar37 = 2;
          if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)
          {
            uVar37 = 0xe;
          }
        }
        local_a7c0 = ray + 0x200;
        puVar33 = local_9e40;
        local_9e50 = 0xfffffffffffffff8;
        pauVar32 = (undefined1 (*) [64])local_8c40;
        local_8c80 = local_a100;
        local_a7b0 = (undefined1 (*) [32])local_a480;
        auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
        auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
        auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
        auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        local_a7d8 = ray;
        local_a7d0 = uVar37;
        local_a7c8 = context;
        local_a770 = This;
        local_8cc0 = auVar42;
        uStack_8c7c = uStack_a0fc;
        uStack_8c78 = uStack_a0f8;
        uStack_8c74 = uStack_a0f4;
        uStack_8c70 = uStack_a0f0;
        uStack_8c6c = uStack_a0ec;
        uStack_8c68 = uStack_a0e8;
        uStack_8c64 = uStack_a0e4;
        uStack_8c60 = uStack_a0e0;
        uStack_8c5c = uStack_a0dc;
        uStack_8c58 = uStack_a0d8;
        uStack_8c54 = uStack_a0d4;
        uStack_8c50 = uStack_a0d0;
        uStack_8c4c = uStack_a0cc;
        uStack_8c48 = uStack_a0c8;
        uStack_8c44 = uStack_a0c4;
LAB_0081e457:
        do {
          auVar46._4_4_ = uStack_a0bc;
          auVar46._0_4_ = local_a0c0;
          auVar46._8_4_ = uStack_a0b8;
          auVar46._12_4_ = uStack_a0b4;
          auVar46._16_4_ = uStack_a0b0;
          auVar46._20_4_ = uStack_a0ac;
          auVar46._24_4_ = uStack_a0a8;
          auVar46._28_4_ = uStack_a0a4;
          auVar46._32_4_ = uStack_a0a0;
          auVar46._36_4_ = uStack_a09c;
          auVar46._40_4_ = uStack_a098;
          auVar46._44_4_ = uStack_a094;
          auVar46._48_4_ = uStack_a090;
          auVar46._52_4_ = uStack_a08c;
          auVar46._56_4_ = uStack_a088;
          auVar46._60_4_ = uStack_a084;
          do {
            root.ptr = puVar33[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_0081f569;
            puVar33 = puVar33 + -1;
            auVar57 = pauVar32[-1];
            pauVar32 = pauVar32 + -1;
            uVar30 = vcmpps_avx512f(auVar57,auVar46,1);
          } while ((short)uVar30 == 0);
          uVar35 = (undefined4)uVar30;
          if (uVar37 < (uint)POPCOUNT(uVar35)) {
LAB_0081e4a0:
            do {
              uVar30 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0081f569;
                auVar47._4_4_ = uStack_a0bc;
                auVar47._0_4_ = local_a0c0;
                auVar47._8_4_ = uStack_a0b8;
                auVar47._12_4_ = uStack_a0b4;
                auVar47._16_4_ = uStack_a0b0;
                auVar47._20_4_ = uStack_a0ac;
                auVar47._24_4_ = uStack_a0a8;
                auVar47._28_4_ = uStack_a0a4;
                auVar47._32_4_ = uStack_a0a0;
                auVar47._36_4_ = uStack_a09c;
                auVar47._40_4_ = uStack_a098;
                auVar47._44_4_ = uStack_a094;
                auVar47._48_4_ = uStack_a090;
                auVar47._52_4_ = uStack_a08c;
                auVar47._56_4_ = uStack_a088;
                auVar47._60_4_ = uStack_a084;
                uVar22 = vcmpps_avx512f(auVar57,auVar47,9);
                if ((short)uVar22 == 0) goto LAB_0081e457;
                local_a768 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar28 = uVar36;
                if (local_a768 == 0) goto LAB_0081f42f;
                uVar28 = ~uVar36;
                lVar31 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar30 = 0;
                goto LAB_0081e6b0;
              }
              lVar31 = 0;
              auVar57 = auVar42;
              do {
                uVar20 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8);
                if (uVar20 == 8) break;
                auVar46 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x40 + lVar31 * 4)));
                auVar52._8_8_ = local_a400._8_8_;
                auVar52._0_8_ = local_a400._0_8_;
                auVar52._16_8_ = local_a400._16_8_;
                auVar52._24_8_ = local_a400._24_8_;
                auVar52._32_8_ = local_a400._32_8_;
                auVar52._40_8_ = local_a400._40_8_;
                auVar52._48_8_ = local_a400._48_8_;
                auVar52._56_8_ = local_a400._56_8_;
                auVar53._8_8_ = local_a400._72_8_;
                auVar53._0_8_ = local_a400._64_8_;
                auVar53._16_8_ = local_a400._80_8_;
                auVar53._24_8_ = local_a400._88_8_;
                auVar53._32_8_ = local_a400._96_8_;
                auVar53._40_8_ = local_a400._104_8_;
                auVar53._48_8_ = local_a400._112_8_;
                auVar53._56_8_ = local_a400._120_8_;
                auVar58._8_8_ = local_a400._136_8_;
                auVar58._0_8_ = local_a400._128_8_;
                auVar58._16_8_ = local_a400._144_8_;
                auVar58._24_8_ = local_a400._152_8_;
                auVar58._32_8_ = local_a400._160_8_;
                auVar58._40_8_ = local_a400._168_8_;
                auVar58._48_8_ = local_a400._176_8_;
                auVar58._56_8_ = local_a400._184_8_;
                auVar46 = vsubps_avx512f(auVar46,auVar52);
                auVar46 = vmulps_avx512f(local_a280,auVar46);
                auVar47 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x80 + lVar31 * 4)));
                auVar47 = vsubps_avx512f(auVar47,auVar53);
                auVar47 = vmulps_avx512f(local_a240,auVar47);
                auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xc0 + lVar31 * 4)));
                auVar48 = vsubps_avx512f(auVar48,auVar58);
                auVar48 = vmulps_avx512f(local_a200,auVar48);
                auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x60 + lVar31 * 4)));
                auVar49 = vsubps_avx512f(auVar49,auVar52);
                auVar49 = vmulps_avx512f(local_a280,auVar49);
                auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xa0 + lVar31 * 4)));
                auVar50 = vsubps_avx512f(auVar50,auVar53);
                auVar50 = vmulps_avx512f(local_a240,auVar50);
                auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xe0 + lVar31 * 4)));
                auVar51 = vsubps_avx512f(auVar51,auVar58);
                auVar51 = vmulps_avx512f(local_a200,auVar51);
                auVar52 = vminps_avx512f(auVar46,auVar49);
                auVar53 = vminps_avx512f(auVar47,auVar50);
                auVar52 = vmaxps_avx512f(auVar52,auVar53);
                auVar53 = vminps_avx512f(auVar48,auVar51);
                auVar52 = vmaxps_avx512f(auVar52,auVar53);
                auVar52 = vmulps_avx512f(auVar52,auVar45);
                auVar46 = vmaxps_avx512f(auVar46,auVar49);
                auVar47 = vmaxps_avx512f(auVar47,auVar50);
                auVar46 = vminps_avx512f(auVar46,auVar47);
                auVar47 = vmaxps_avx512f(auVar48,auVar51);
                auVar46 = vminps_avx512f(auVar46,auVar47);
                auVar46 = vmulps_avx512f(auVar46,auVar44);
                auVar61._4_4_ = uStack_a0fc;
                auVar61._0_4_ = local_a100;
                auVar61._8_4_ = uStack_a0f8;
                auVar61._12_4_ = uStack_a0f4;
                auVar61._16_4_ = uStack_a0f0;
                auVar61._20_4_ = uStack_a0ec;
                auVar61._24_4_ = uStack_a0e8;
                auVar61._28_4_ = uStack_a0e4;
                auVar61._32_4_ = uStack_a0e0;
                auVar61._36_4_ = uStack_a0dc;
                auVar61._40_4_ = uStack_a0d8;
                auVar61._44_4_ = uStack_a0d4;
                auVar61._48_4_ = uStack_a0d0;
                auVar61._52_4_ = uStack_a0cc;
                auVar61._56_4_ = uStack_a0c8;
                auVar61._60_4_ = uStack_a0c4;
                auVar47 = vmaxps_avx512f(auVar52,auVar61);
                auVar62._4_4_ = uStack_a0bc;
                auVar62._0_4_ = local_a0c0;
                auVar62._8_4_ = uStack_a0b8;
                auVar62._12_4_ = uStack_a0b4;
                auVar62._16_4_ = uStack_a0b0;
                auVar62._20_4_ = uStack_a0ac;
                auVar62._24_4_ = uStack_a0a8;
                auVar62._28_4_ = uStack_a0a4;
                auVar62._32_4_ = uStack_a0a0;
                auVar62._36_4_ = uStack_a09c;
                auVar62._40_4_ = uStack_a098;
                auVar62._44_4_ = uStack_a094;
                auVar62._48_4_ = uStack_a090;
                auVar62._52_4_ = uStack_a08c;
                auVar62._56_4_ = uStack_a088;
                auVar62._60_4_ = uStack_a084;
                auVar46 = vminps_avx512f(auVar46,auVar62);
                uVar21 = vcmpps_avx512f(auVar47,auVar46,2);
                uVar24 = uVar30;
                auVar63 = auVar57;
                if ((short)uVar21 != 0) {
                  auVar46 = vblendmps_avx512f(auVar42,auVar52);
                  bVar26 = (bool)((byte)uVar21 & 1);
                  auVar63._0_4_ = (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * auVar52._0_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
                  auVar63._4_4_ = (uint)bVar26 * auVar46._4_4_ | (uint)!bVar26 * auVar52._4_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
                  auVar63._8_4_ = (uint)bVar26 * auVar46._8_4_ | (uint)!bVar26 * auVar52._8_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
                  auVar63._12_4_ = (uint)bVar26 * auVar46._12_4_ | (uint)!bVar26 * auVar52._12_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
                  auVar63._16_4_ = (uint)bVar26 * auVar46._16_4_ | (uint)!bVar26 * auVar52._16_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
                  auVar63._20_4_ = (uint)bVar26 * auVar46._20_4_ | (uint)!bVar26 * auVar52._20_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
                  auVar63._24_4_ = (uint)bVar26 * auVar46._24_4_ | (uint)!bVar26 * auVar52._24_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
                  auVar63._28_4_ = (uint)bVar26 * auVar46._28_4_ | (uint)!bVar26 * auVar52._28_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
                  auVar63._32_4_ = (uint)bVar26 * auVar46._32_4_ | (uint)!bVar26 * auVar52._32_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
                  auVar63._36_4_ = (uint)bVar26 * auVar46._36_4_ | (uint)!bVar26 * auVar52._36_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
                  auVar63._40_4_ = (uint)bVar26 * auVar46._40_4_ | (uint)!bVar26 * auVar52._40_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
                  auVar63._44_4_ = (uint)bVar26 * auVar46._44_4_ | (uint)!bVar26 * auVar52._44_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
                  auVar63._48_4_ = (uint)bVar26 * auVar46._48_4_ | (uint)!bVar26 * auVar52._48_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
                  auVar63._52_4_ = (uint)bVar26 * auVar46._52_4_ | (uint)!bVar26 * auVar52._52_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
                  auVar63._56_4_ = (uint)bVar26 * auVar46._56_4_ | (uint)!bVar26 * auVar52._56_4_;
                  bVar26 = SUB81(uVar21 >> 0xf,0);
                  auVar63._60_4_ = (uint)bVar26 * auVar46._60_4_ | (uint)!bVar26 * auVar52._60_4_;
                  uVar24 = uVar20;
                  if (uVar30 != 8) {
                    *puVar33 = uVar30;
                    puVar33 = puVar33 + 1;
                    *pauVar32 = auVar57;
                    pauVar32 = pauVar32 + 1;
                  }
                }
                auVar57 = auVar63;
                uVar30 = uVar24;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 8);
              if (uVar30 == 8) goto LAB_0081e657;
              auVar65._4_4_ = uStack_a0bc;
              auVar65._0_4_ = local_a0c0;
              auVar65._8_4_ = uStack_a0b8;
              auVar65._12_4_ = uStack_a0b4;
              auVar65._16_4_ = uStack_a0b0;
              auVar65._20_4_ = uStack_a0ac;
              auVar65._24_4_ = uStack_a0a8;
              auVar65._28_4_ = uStack_a0a4;
              auVar65._32_4_ = uStack_a0a0;
              auVar65._36_4_ = uStack_a09c;
              auVar65._40_4_ = uStack_a098;
              auVar65._44_4_ = uStack_a094;
              auVar65._48_4_ = uStack_a090;
              auVar65._52_4_ = uStack_a08c;
              auVar65._56_4_ = uStack_a088;
              auVar65._60_4_ = uStack_a084;
              uVar22 = vcmpps_avx512f(auVar57,auVar65,9);
              root.ptr = uVar30;
            } while ((ushort)uVar37 < (ushort)POPCOUNT((int)uVar22));
            *puVar33 = uVar30;
            puVar33 = puVar33 + 1;
            *pauVar32 = auVar57;
            pauVar32 = pauVar32 + 1;
LAB_0081e657:
            iVar38 = 4;
          }
          else {
            do {
              local_a740 = auVar57;
              k = 0;
              for (uVar37 = uVar30; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              bVar26 = occluded1(local_a770,local_a778,root,k,&local_a7d9,local_a7d8,
                                 (TravRayK<16,_true> *)&local_a400.field_0,context);
              uVar28 = 1 << ((uint)k & 0x1f);
              if (!bVar26) {
                uVar28 = 0;
              }
              uVar36 = uVar36 | uVar28;
              uVar30 = uVar30 - 1 & uVar30;
              context = local_a7c8;
              auVar57 = local_a740;
            } while (uVar30 != 0);
            iVar38 = 3;
            if ((short)uVar36 != -1) {
              auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar26 = (bool)((byte)uVar36 & 1);
              local_a0c0 = (uint)bVar26 * auVar40._0_4_ | !bVar26 * local_a0c0;
              bVar26 = (bool)((byte)(uVar36 >> 1) & 1);
              uStack_a0bc = (uint)bVar26 * auVar40._4_4_ | !bVar26 * uStack_a0bc;
              bVar26 = (bool)((byte)(uVar36 >> 2) & 1);
              uStack_a0b8 = (uint)bVar26 * auVar40._8_4_ | !bVar26 * uStack_a0b8;
              bVar26 = (bool)((byte)(uVar36 >> 3) & 1);
              uStack_a0b4 = (uint)bVar26 * auVar40._12_4_ | !bVar26 * uStack_a0b4;
              bVar26 = (bool)((byte)(uVar36 >> 4) & 1);
              uStack_a0b0 = (uint)bVar26 * auVar40._16_4_ | !bVar26 * uStack_a0b0;
              bVar26 = (bool)((byte)(uVar36 >> 5) & 1);
              uStack_a0ac = (uint)bVar26 * auVar40._20_4_ | !bVar26 * uStack_a0ac;
              bVar26 = (bool)((byte)(uVar36 >> 6) & 1);
              uStack_a0a8 = (uint)bVar26 * auVar40._24_4_ | !bVar26 * uStack_a0a8;
              bVar26 = (bool)((byte)(uVar36 >> 7) & 1);
              uStack_a0a4 = (uint)bVar26 * auVar40._28_4_ | !bVar26 * uStack_a0a4;
              bVar26 = (bool)((byte)(uVar36 >> 8) & 1);
              uStack_a0a0 = (uint)bVar26 * auVar40._32_4_ | !bVar26 * uStack_a0a0;
              bVar26 = (bool)((byte)(uVar36 >> 9) & 1);
              uStack_a09c = (uint)bVar26 * auVar40._36_4_ | !bVar26 * uStack_a09c;
              bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
              uStack_a098 = (uint)bVar26 * auVar40._40_4_ | !bVar26 * uStack_a098;
              bVar26 = (bool)((byte)(uVar36 >> 0xb) & 1);
              uStack_a094 = (uint)bVar26 * auVar40._44_4_ | !bVar26 * uStack_a094;
              bVar26 = (bool)((byte)(uVar36 >> 0xc) & 1);
              uStack_a090 = (uint)bVar26 * auVar40._48_4_ | !bVar26 * uStack_a090;
              bVar26 = (bool)((byte)(uVar36 >> 0xd) & 1);
              uStack_a08c = (uint)bVar26 * auVar40._52_4_ | !bVar26 * uStack_a08c;
              bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
              uStack_a088 = (uint)bVar26 * auVar40._56_4_ | !bVar26 * uStack_a088;
              bVar26 = (bool)((byte)(uVar36 >> 0xf) & 1);
              uStack_a084 = (uint)bVar26 * auVar40._60_4_ | !bVar26 * uStack_a084;
              iVar38 = 2;
            }
            auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
            auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
            auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
            auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
            auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            ray = local_a7d8;
            uVar37 = local_a7d0;
            if ((uint)local_a7d0 < (uint)POPCOUNT(uVar35)) goto LAB_0081e4a0;
          }
        } while (iVar38 != 3);
LAB_0081f569:
        uVar36 = uVar36 & local_a7b8;
        auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        bVar26 = (bool)((byte)uVar36 & 1);
        bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
        bVar12 = (bool)((byte)(uVar36 >> 8) & 1);
        bVar13 = (bool)((byte)(uVar36 >> 9) & 1);
        bVar14 = (bool)((byte)(uVar36 >> 10) & 1);
        bVar15 = (bool)((byte)(uVar36 >> 0xb) & 1);
        bVar16 = (bool)((byte)(uVar36 >> 0xc) & 1);
        bVar17 = (bool)((byte)(uVar36 >> 0xd) & 1);
        bVar18 = (bool)((byte)(uVar36 >> 0xe) & 1);
        bVar19 = (bool)((byte)(uVar36 >> 0xf) & 1);
        *(uint *)local_a7c0 = (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * *(int *)local_a7c0;
        *(uint *)(local_a7c0 + 4) =
             (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * *(int *)(local_a7c0 + 4);
        *(uint *)(local_a7c0 + 8) =
             (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * *(int *)(local_a7c0 + 8);
        *(uint *)(local_a7c0 + 0xc) =
             (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * *(int *)(local_a7c0 + 0xc);
        *(uint *)(local_a7c0 + 0x10) =
             (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * *(int *)(local_a7c0 + 0x10);
        *(uint *)(local_a7c0 + 0x14) =
             (uint)bVar8 * auVar40._20_4_ | (uint)!bVar8 * *(int *)(local_a7c0 + 0x14);
        *(uint *)(local_a7c0 + 0x18) =
             (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * *(int *)(local_a7c0 + 0x18);
        *(uint *)(local_a7c0 + 0x1c) =
             (uint)bVar10 * auVar40._28_4_ | (uint)!bVar10 * *(int *)(local_a7c0 + 0x1c);
        *(uint *)(local_a7c0 + 0x20) =
             (uint)bVar12 * auVar40._32_4_ | (uint)!bVar12 * *(int *)(local_a7c0 + 0x20);
        *(uint *)(local_a7c0 + 0x24) =
             (uint)bVar13 * auVar40._36_4_ | (uint)!bVar13 * *(int *)(local_a7c0 + 0x24);
        *(uint *)(local_a7c0 + 0x28) =
             (uint)bVar14 * auVar40._40_4_ | (uint)!bVar14 * *(int *)(local_a7c0 + 0x28);
        *(uint *)(local_a7c0 + 0x2c) =
             (uint)bVar15 * auVar40._44_4_ | (uint)!bVar15 * *(int *)(local_a7c0 + 0x2c);
        *(uint *)(local_a7c0 + 0x30) =
             (uint)bVar16 * auVar40._48_4_ | (uint)!bVar16 * *(int *)(local_a7c0 + 0x30);
        *(uint *)(local_a7c0 + 0x34) =
             (uint)bVar17 * auVar40._52_4_ | (uint)!bVar17 * *(int *)(local_a7c0 + 0x34);
        *(uint *)(local_a7c0 + 0x38) =
             (uint)bVar18 * auVar40._56_4_ | (uint)!bVar18 * *(int *)(local_a7c0 + 0x38);
        *(uint *)(local_a7c0 + 0x3c) =
             (uint)bVar19 * auVar40._60_4_ | (uint)!bVar19 * *(int *)(local_a7c0 + 0x3c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar30 = local_a760 + 1;
    lVar31 = lVar31 + 0xe0;
    if (local_a768 <= uVar30) break;
LAB_0081e6b0:
    local_a758 = uVar30 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar34 = 0;
    local_a740._0_8_ = lVar31;
    local_a7b4 = uVar28;
    local_a760 = uVar30;
    do {
      uVar29 = (ushort)uVar28;
      uVar30 = (ulong)*(uint *)(lVar31 + lVar34 * 4);
      if (uVar30 == 0xffffffff) break;
      auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0xc0 + lVar34 * 4)));
      auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0xb0 + lVar34 * 4)));
      auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0xa0 + lVar34 * 4)));
      local_a6c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x90 + lVar34 * 4)));
      local_9ec0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x80 + lVar34 * 4)));
      local_9f00 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x70 + lVar34 * 4)));
      local_9f40 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x60 + lVar34 * 4)));
      local_9f80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x50 + lVar34 * 4)));
      local_9fc0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x40 + lVar34 * 4)));
      local_a000 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x30 + lVar34 * 4)));
      local_a040 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x20 + lVar34 * 4)));
      local_a080 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar31 + -0x10 + lVar34 * 4)));
      local_a750 = *(undefined8 *)(local_a758 + 0xd0);
      uStack_a748 = *(undefined8 *)(local_a758 + 0xd8);
      auVar46 = *(undefined1 (*) [64])ray;
      auVar57 = *(undefined1 (*) [64])(ray + 0x40);
      auVar47 = *(undefined1 (*) [64])(ray + 0x80);
      auVar48 = *(undefined1 (*) [64])(ray + 0x100);
      auVar49 = *(undefined1 (*) [64])(ray + 0x140);
      auVar50 = *(undefined1 (*) [64])(ray + 0x180);
      auVar51 = vsubps_avx512f(auVar51,auVar46);
      auVar52 = vsubps_avx512f(auVar52,auVar57);
      auVar53 = vsubps_avx512f(auVar53,auVar47);
      auVar54 = vsubps_avx512f(local_a6c0,auVar46);
      auVar55 = vsubps_avx512f(local_9ec0,auVar57);
      auVar56 = vsubps_avx512f(local_9f00,auVar47);
      auVar46 = vsubps_avx512f(local_a000,auVar46);
      auVar57 = vsubps_avx512f(local_a040,auVar57);
      auVar47 = vsubps_avx512f(local_a080,auVar47);
      auVar58 = vsubps_avx512f(auVar46,auVar51);
      auVar59 = vsubps_avx512f(auVar57,auVar52);
      auVar60 = vsubps_avx512f(auVar47,auVar53);
      auVar61 = vsubps_avx512f(auVar51,auVar54);
      auVar62 = vsubps_avx512f(auVar52,auVar55);
      auVar63 = vsubps_avx512f(auVar53,auVar56);
      auVar64 = vaddps_avx512f(auVar46,auVar51);
      auVar65 = vaddps_avx512f(auVar57,auVar52);
      auVar66 = vaddps_avx512f(auVar47,auVar53);
      auVar67 = vmulps_avx512f(auVar65,auVar60);
      auVar67 = vfmsub231ps_avx512f(auVar67,auVar59,auVar66);
      auVar66 = vmulps_avx512f(auVar66,auVar58);
      auVar66 = vfmsub231ps_avx512f(auVar66,auVar60,auVar64);
      auVar64 = vmulps_avx512f(auVar64,auVar59);
      auVar64 = vfmsub231ps_avx512f(auVar64,auVar58,auVar65);
      auVar64 = vmulps_avx512f(auVar64,auVar50);
      auVar64 = vfmadd231ps_avx512f(auVar64,auVar49,auVar66);
      auVar64 = vfmadd231ps_avx512f(auVar64,auVar48,auVar67);
      auVar65 = vaddps_avx512f(auVar51,auVar54);
      auVar66 = vaddps_avx512f(auVar52,auVar55);
      auVar67 = vaddps_avx512f(auVar53,auVar56);
      auVar68 = vmulps_avx512f(auVar66,auVar63);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar62,auVar67);
      auVar67 = vmulps_avx512f(auVar67,auVar61);
      auVar67 = vfmsub231ps_avx512f(auVar67,auVar63,auVar65);
      auVar65 = vmulps_avx512f(auVar65,auVar62);
      auVar65 = vfmsub231ps_avx512f(auVar65,auVar61,auVar66);
      auVar66 = vsubps_avx512f(auVar54,auVar46);
      auVar65 = vmulps_avx512f(auVar65,auVar50);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar49,auVar67);
      auVar67 = vsubps_avx512f(auVar55,auVar57);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar48,auVar68);
      auVar68 = vsubps_avx512f(auVar56,auVar47);
      auVar46 = vaddps_avx512f(auVar54,auVar46);
      auVar57 = vaddps_avx512f(auVar55,auVar57);
      auVar47 = vaddps_avx512f(auVar56,auVar47);
      auVar54 = vmulps_avx512f(auVar57,auVar68);
      auVar54 = vfmsub231ps_avx512f(auVar54,auVar67,auVar47);
      auVar47 = vmulps_avx512f(auVar47,auVar66);
      auVar47 = vfmsub231ps_avx512f(auVar47,auVar68,auVar46);
      auVar46 = vmulps_avx512f(auVar46,auVar67);
      auVar46 = vfmsub231ps_avx512f(auVar46,auVar66,auVar57);
      auVar46 = vmulps_avx512f(auVar46,auVar50);
      auVar46 = vfmadd231ps_avx512f(auVar46,auVar49,auVar47);
      auVar46 = vfmadd231ps_avx512f(auVar46,auVar48,auVar54);
      auVar57 = vaddps_avx512f(auVar64,auVar65);
      auVar57 = vaddps_avx512f(auVar46,auVar57);
      auVar47 = vandps_avx512dq(auVar57,auVar41);
      auVar54 = vmulps_avx512f(auVar47,auVar86);
      auVar55 = vminps_avx512f(auVar64,auVar65);
      auVar55 = vminps_avx512f(auVar55,auVar46);
      auVar56 = vxorps_avx512dq(auVar54,auVar40);
      uVar22 = vcmpps_avx512f(auVar55,auVar56,5);
      auVar55 = vmaxps_avx512f(auVar64,auVar65);
      auVar46 = vmaxps_avx512f(auVar55,auVar46);
      uVar23 = vcmpps_avx512f(auVar46,auVar54,2);
      uVar29 = ((ushort)uVar22 | (ushort)uVar23) & uVar29;
      if (uVar29 != 0) {
        auVar46 = vmulps_avx512f(auVar62,auVar60);
        auVar54 = vmulps_avx512f(auVar58,auVar63);
        auVar55 = vmulps_avx512f(auVar61,auVar59);
        auVar56 = vmulps_avx512f(auVar67,auVar63);
        auVar69 = vmulps_avx512f(auVar61,auVar68);
        auVar70 = vmulps_avx512f(auVar66,auVar62);
        auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar46);
        auVar60 = vfmsub213ps_avx512f(auVar60,auVar61,auVar54);
        auVar58 = vfmsub213ps_avx512f(auVar58,auVar62,auVar55);
        auVar62 = vfmsub213ps_avx512f(auVar68,auVar62,auVar56);
        auVar63 = vfmsub213ps_avx512f(auVar66,auVar63,auVar69);
        auVar61 = vfmsub213ps_avx512f(auVar67,auVar61,auVar70);
        auVar46 = vandps_avx512dq(auVar46,auVar41);
        auVar56 = vandps_avx512dq(auVar56,auVar41);
        uVar20 = vcmpps_avx512f(auVar46,auVar56,1);
        auVar46 = vandps_avx512dq(auVar54,auVar41);
        auVar54 = vandps_avx512dq(auVar69,auVar41);
        uVar21 = vcmpps_avx512f(auVar46,auVar54,1);
        auVar46 = vandps_avx512dq(auVar55,auVar41);
        auVar54 = vandps_avx512dq(auVar70,auVar41);
        uVar24 = vcmpps_avx512f(auVar46,auVar54,1);
        bVar26 = (bool)((byte)uVar20 & 1);
        auVar54._0_4_ = (uint)bVar26 * auVar59._0_4_ | (uint)!bVar26 * auVar62._0_4_;
        bVar26 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar26 * auVar59._4_4_ | (uint)!bVar26 * auVar62._4_4_;
        bVar26 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar26 * auVar59._8_4_ | (uint)!bVar26 * auVar62._8_4_;
        bVar26 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar26 * auVar59._12_4_ | (uint)!bVar26 * auVar62._12_4_;
        bVar26 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar26 * auVar59._16_4_ | (uint)!bVar26 * auVar62._16_4_;
        bVar26 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar26 * auVar59._20_4_ | (uint)!bVar26 * auVar62._20_4_;
        bVar26 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar26 * auVar59._24_4_ | (uint)!bVar26 * auVar62._24_4_;
        bVar26 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar54._28_4_ = (uint)bVar26 * auVar59._28_4_ | (uint)!bVar26 * auVar62._28_4_;
        bVar26 = (bool)((byte)(uVar20 >> 8) & 1);
        auVar54._32_4_ = (uint)bVar26 * auVar59._32_4_ | (uint)!bVar26 * auVar62._32_4_;
        bVar26 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar54._36_4_ = (uint)bVar26 * auVar59._36_4_ | (uint)!bVar26 * auVar62._36_4_;
        bVar26 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar54._40_4_ = (uint)bVar26 * auVar59._40_4_ | (uint)!bVar26 * auVar62._40_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar54._44_4_ = (uint)bVar26 * auVar59._44_4_ | (uint)!bVar26 * auVar62._44_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar54._48_4_ = (uint)bVar26 * auVar59._48_4_ | (uint)!bVar26 * auVar62._48_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar54._52_4_ = (uint)bVar26 * auVar59._52_4_ | (uint)!bVar26 * auVar62._52_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar54._56_4_ = (uint)bVar26 * auVar59._56_4_ | (uint)!bVar26 * auVar62._56_4_;
        bVar26 = SUB81(uVar20 >> 0xf,0);
        auVar54._60_4_ = (uint)bVar26 * auVar59._60_4_ | (uint)!bVar26 * auVar62._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        auVar55._0_4_ = (uint)bVar26 * auVar60._0_4_ | (uint)!bVar26 * auVar63._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar26 * auVar60._4_4_ | (uint)!bVar26 * auVar63._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar26 * auVar60._8_4_ | (uint)!bVar26 * auVar63._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar26 * auVar60._12_4_ | (uint)!bVar26 * auVar63._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar26 * auVar60._16_4_ | (uint)!bVar26 * auVar63._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar26 * auVar60._20_4_ | (uint)!bVar26 * auVar63._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar26 * auVar60._24_4_ | (uint)!bVar26 * auVar63._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar55._28_4_ = (uint)bVar26 * auVar60._28_4_ | (uint)!bVar26 * auVar63._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        auVar55._32_4_ = (uint)bVar26 * auVar60._32_4_ | (uint)!bVar26 * auVar63._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        auVar55._36_4_ = (uint)bVar26 * auVar60._36_4_ | (uint)!bVar26 * auVar63._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        auVar55._40_4_ = (uint)bVar26 * auVar60._40_4_ | (uint)!bVar26 * auVar63._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        auVar55._44_4_ = (uint)bVar26 * auVar60._44_4_ | (uint)!bVar26 * auVar63._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        auVar55._48_4_ = (uint)bVar26 * auVar60._48_4_ | (uint)!bVar26 * auVar63._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        auVar55._52_4_ = (uint)bVar26 * auVar60._52_4_ | (uint)!bVar26 * auVar63._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        auVar55._56_4_ = (uint)bVar26 * auVar60._56_4_ | (uint)!bVar26 * auVar63._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        auVar55._60_4_ = (uint)bVar26 * auVar60._60_4_ | (uint)!bVar26 * auVar63._60_4_;
        bVar26 = (bool)((byte)uVar24 & 1);
        auVar56._0_4_ = (uint)bVar26 * auVar58._0_4_ | (uint)!bVar26 * auVar61._0_4_;
        bVar26 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar26 * auVar58._4_4_ | (uint)!bVar26 * auVar61._4_4_;
        bVar26 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar26 * auVar58._8_4_ | (uint)!bVar26 * auVar61._8_4_;
        bVar26 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar26 * auVar58._12_4_ | (uint)!bVar26 * auVar61._12_4_;
        bVar26 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar26 * auVar58._16_4_ | (uint)!bVar26 * auVar61._16_4_;
        bVar26 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar26 * auVar58._20_4_ | (uint)!bVar26 * auVar61._20_4_;
        bVar26 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar26 * auVar58._24_4_ | (uint)!bVar26 * auVar61._24_4_;
        bVar26 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar56._28_4_ = (uint)bVar26 * auVar58._28_4_ | (uint)!bVar26 * auVar61._28_4_;
        bVar26 = (bool)((byte)(uVar24 >> 8) & 1);
        auVar56._32_4_ = (uint)bVar26 * auVar58._32_4_ | (uint)!bVar26 * auVar61._32_4_;
        bVar26 = (bool)((byte)(uVar24 >> 9) & 1);
        auVar56._36_4_ = (uint)bVar26 * auVar58._36_4_ | (uint)!bVar26 * auVar61._36_4_;
        bVar26 = (bool)((byte)(uVar24 >> 10) & 1);
        auVar56._40_4_ = (uint)bVar26 * auVar58._40_4_ | (uint)!bVar26 * auVar61._40_4_;
        bVar26 = (bool)((byte)(uVar24 >> 0xb) & 1);
        auVar56._44_4_ = (uint)bVar26 * auVar58._44_4_ | (uint)!bVar26 * auVar61._44_4_;
        bVar26 = (bool)((byte)(uVar24 >> 0xc) & 1);
        auVar56._48_4_ = (uint)bVar26 * auVar58._48_4_ | (uint)!bVar26 * auVar61._48_4_;
        bVar26 = (bool)((byte)(uVar24 >> 0xd) & 1);
        auVar56._52_4_ = (uint)bVar26 * auVar58._52_4_ | (uint)!bVar26 * auVar61._52_4_;
        bVar26 = (bool)((byte)(uVar24 >> 0xe) & 1);
        auVar56._56_4_ = (uint)bVar26 * auVar58._56_4_ | (uint)!bVar26 * auVar61._56_4_;
        bVar26 = SUB81(uVar24 >> 0xf,0);
        auVar56._60_4_ = (uint)bVar26 * auVar58._60_4_ | (uint)!bVar26 * auVar61._60_4_;
        auVar46 = vmulps_avx512f(auVar50,auVar56);
        auVar46 = vfmadd213ps_avx512f(auVar49,auVar55,auVar46);
        auVar46 = vfmadd213ps_avx512f(auVar48,auVar54,auVar46);
        auVar48 = vaddps_avx512f(auVar46,auVar46);
        auVar46 = vmulps_avx512f(auVar53,auVar56);
        auVar46 = vfmadd213ps_avx512f(auVar52,auVar55,auVar46);
        auVar46 = vfmadd213ps_avx512f(auVar51,auVar54,auVar46);
        auVar49 = vrcp14ps_avx512f(auVar48);
        auVar46 = vaddps_avx512f(auVar46,auVar46);
        auVar50 = vfnmadd213ps_avx512f(auVar49,auVar48,auVar43);
        auVar49 = vfmadd132ps_avx512f(auVar50,auVar49,auVar49);
        auVar49 = vmulps_avx512f(auVar46,auVar49);
        auVar46 = *(undefined1 (*) [64])(ray + 0x200);
        uVar22 = vcmpps_avx512f(auVar49,auVar46,2);
        uVar23 = vcmpps_avx512f(auVar49,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar25 = vcmpps_avx512f(auVar48,_DAT_01ff2200,4);
        uVar29 = uVar29 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar25;
        if (uVar29 != 0) {
          pGVar1 = (context->scene->geometries).items[uVar30].ptr;
          auVar48 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
          uVar22 = vptestmd_avx512f(auVar48,*(undefined1 (*) [64])(ray + 0x240));
          uVar29 = uVar29 & (ushort)uVar22;
          if (uVar29 != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              lVar31 = local_a740._0_8_;
            }
            else {
              auVar48._8_4_ = 0x219392ef;
              auVar48._0_8_ = 0x219392ef219392ef;
              auVar48._12_4_ = 0x219392ef;
              auVar48._16_4_ = 0x219392ef;
              auVar48._20_4_ = 0x219392ef;
              auVar48._24_4_ = 0x219392ef;
              auVar48._28_4_ = 0x219392ef;
              auVar48._32_4_ = 0x219392ef;
              auVar48._36_4_ = 0x219392ef;
              auVar48._40_4_ = 0x219392ef;
              auVar48._44_4_ = 0x219392ef;
              auVar48._48_4_ = 0x219392ef;
              auVar48._52_4_ = 0x219392ef;
              auVar48._56_4_ = 0x219392ef;
              auVar48._60_4_ = 0x219392ef;
              uVar30 = vcmpps_avx512f(auVar47,auVar48,5);
              auVar47 = vrcp14ps_avx512f(auVar57);
              auVar57 = vfnmadd213ps_avx512f(auVar57,auVar47,auVar43);
              auVar57 = vfmadd132ps_avx512f(auVar57,auVar47,auVar47);
              auVar50._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar57._4_4_;
              auVar50._0_4_ = (uint)((byte)uVar30 & 1) * auVar57._0_4_;
              auVar50._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar57._8_4_;
              auVar50._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar57._12_4_;
              auVar50._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar57._16_4_;
              auVar50._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar57._20_4_;
              auVar50._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar57._24_4_;
              auVar50._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar57._28_4_;
              auVar50._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar57._32_4_;
              auVar50._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar57._36_4_;
              auVar50._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar57._40_4_;
              auVar50._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar57._44_4_;
              auVar50._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar57._48_4_;
              auVar50._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar57._52_4_;
              auVar50._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar57._56_4_;
              auVar50._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar57._60_4_;
              auVar57 = vmulps_avx512f(auVar64,auVar50);
              local_a580 = vminps_avx512f(auVar57,auVar43);
              auVar57 = vmulps_avx512f(auVar65,auVar50);
              local_a540 = vminps_avx512f(auVar57,auVar43);
              pRVar2 = context->user;
              auVar57 = vpbroadcastd_avx512f();
              auVar47 = vpbroadcastd_avx512f();
              local_a500 = vmovdqa64_avx512f(auVar47);
              local_a4c0 = vmovdqa64_avx512f(auVar57);
              auVar39 = vpcmpeqd_avx2(local_a580._0_32_,local_a580._0_32_);
              local_a7b0[3] = auVar39;
              local_a7b0[2] = auVar39;
              local_a7b0[1] = auVar39;
              *local_a7b0 = auVar39;
              local_a480 = vbroadcastss_avx512f(ZEXT416(pRVar2->instID[0]));
              local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar2->instPrimID[0]));
              auVar57 = vblendmps_avx512f(auVar46,auVar49);
              bVar26 = (bool)((byte)uVar29 & 1);
              bVar4 = (bool)((byte)(uVar29 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar29 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar29 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar29 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar29 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar29 >> 7) & 1);
              bVar11 = (byte)(uVar29 >> 8);
              bVar12 = (bool)(bVar11 >> 1 & 1);
              bVar13 = (bool)(bVar11 >> 2 & 1);
              bVar14 = (bool)(bVar11 >> 3 & 1);
              bVar15 = (bool)(bVar11 >> 4 & 1);
              bVar16 = (bool)(bVar11 >> 5 & 1);
              bVar17 = (bool)(bVar11 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar26 * auVar57._0_4_ | (uint)!bVar26 * local_a440._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar4 * auVar57._4_4_ | (uint)!bVar4 * local_a440._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar5 * auVar57._8_4_ | (uint)!bVar5 * local_a440._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar6 * auVar57._12_4_ | (uint)!bVar6 * local_a440._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar7 * auVar57._16_4_ | (uint)!bVar7 * local_a440._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar8 * auVar57._20_4_ | (uint)!bVar8 * local_a440._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * local_a440._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar10 * auVar57._28_4_ | (uint)!bVar10 * local_a440._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar11 & 1) * auVar57._32_4_ |
                   (uint)!(bool)(bVar11 & 1) * local_a440._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar12 * auVar57._36_4_ | (uint)!bVar12 * local_a440._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar13 * auVar57._40_4_ | (uint)!bVar13 * local_a440._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar14 * auVar57._44_4_ | (uint)!bVar14 * local_a440._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar15 * auVar57._48_4_ | (uint)!bVar15 * local_a440._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar16 * auVar57._52_4_ | (uint)!bVar16 * local_a440._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar17 * auVar57._56_4_ | (uint)!bVar17 * local_a440._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar29 >> 0xf) * auVar57._60_4_ |
                   (uint)!(bool)(bVar11 >> 7) * local_a440._60_4_;
              auVar57 = vpmovm2d_avx512dq((ulong)uVar29);
              local_a700 = vmovdqa64_avx512f(auVar57);
              local_a7a8.valid = (int *)local_a700;
              local_a7a8.geometryUserPtr = pGVar1->userPtr;
              local_a7a8.context = context->user;
              local_a7a8.hit = local_a640;
              local_a7a8.N = 0x10;
              local_a7a8.ray = (RTCRayN *)ray;
              local_a680 = auVar46;
              local_a640 = (RTCHitN  [64])auVar54;
              local_a600 = auVar55;
              local_a5c0 = auVar56;
              if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar1->occlusionFilterN)(&local_a7a8);
                auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar57 = vmovdqa64_avx512f(local_a700);
                ray = local_a7d8;
                uVar37 = local_a7d0;
                context = local_a7c8;
              }
              uVar22 = vptestmd_avx512f(auVar57,auVar57);
              if ((short)uVar22 == 0) {
                uVar30 = 0;
                lVar31 = local_a740._0_8_;
              }
              else {
                p_Var3 = context->args->filter;
                if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar1->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var3)(&local_a7a8);
                  auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                  auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar57 = vmovdqa64_avx512f(local_a700);
                  ray = local_a7d8;
                  uVar37 = local_a7d0;
                  context = local_a7c8;
                }
                uVar30 = vptestmd_avx512f(auVar57,auVar57);
                auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar26 = (bool)((byte)uVar30 & 1);
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar30 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar30 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar30 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar30 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar30 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar30 >> 0xe) & 1);
                bVar19 = SUB81(uVar30 >> 0xf,0);
                *(uint *)(local_a7a8.ray + 0x200) =
                     (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * *(int *)(local_a7a8.ray + 0x200)
                ;
                *(uint *)(local_a7a8.ray + 0x204) =
                     (uint)bVar4 * auVar46._4_4_ | (uint)!bVar4 * *(int *)(local_a7a8.ray + 0x204);
                *(uint *)(local_a7a8.ray + 0x208) =
                     (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * *(int *)(local_a7a8.ray + 0x208);
                *(uint *)(local_a7a8.ray + 0x20c) =
                     (uint)bVar6 * auVar46._12_4_ | (uint)!bVar6 * *(int *)(local_a7a8.ray + 0x20c);
                *(uint *)(local_a7a8.ray + 0x210) =
                     (uint)bVar7 * auVar46._16_4_ | (uint)!bVar7 * *(int *)(local_a7a8.ray + 0x210);
                *(uint *)(local_a7a8.ray + 0x214) =
                     (uint)bVar8 * auVar46._20_4_ | (uint)!bVar8 * *(int *)(local_a7a8.ray + 0x214);
                *(uint *)(local_a7a8.ray + 0x218) =
                     (uint)bVar9 * auVar46._24_4_ | (uint)!bVar9 * *(int *)(local_a7a8.ray + 0x218);
                *(uint *)(local_a7a8.ray + 0x21c) =
                     (uint)bVar10 * auVar46._28_4_ |
                     (uint)!bVar10 * *(int *)(local_a7a8.ray + 0x21c);
                *(uint *)(local_a7a8.ray + 0x220) =
                     (uint)bVar12 * auVar46._32_4_ |
                     (uint)!bVar12 * *(int *)(local_a7a8.ray + 0x220);
                *(uint *)(local_a7a8.ray + 0x224) =
                     (uint)bVar13 * auVar46._36_4_ |
                     (uint)!bVar13 * *(int *)(local_a7a8.ray + 0x224);
                *(uint *)(local_a7a8.ray + 0x228) =
                     (uint)bVar14 * auVar46._40_4_ |
                     (uint)!bVar14 * *(int *)(local_a7a8.ray + 0x228);
                *(uint *)(local_a7a8.ray + 0x22c) =
                     (uint)bVar15 * auVar46._44_4_ |
                     (uint)!bVar15 * *(int *)(local_a7a8.ray + 0x22c);
                *(uint *)(local_a7a8.ray + 0x230) =
                     (uint)bVar16 * auVar46._48_4_ |
                     (uint)!bVar16 * *(int *)(local_a7a8.ray + 0x230);
                *(uint *)(local_a7a8.ray + 0x234) =
                     (uint)bVar17 * auVar46._52_4_ |
                     (uint)!bVar17 * *(int *)(local_a7a8.ray + 0x234);
                *(uint *)(local_a7a8.ray + 0x238) =
                     (uint)bVar18 * auVar46._56_4_ |
                     (uint)!bVar18 * *(int *)(local_a7a8.ray + 0x238);
                *(uint *)(local_a7a8.ray + 0x23c) =
                     (uint)bVar19 * auVar46._60_4_ |
                     (uint)!bVar19 * *(int *)(local_a7a8.ray + 0x23c);
                lVar31 = local_a740._0_8_;
              }
              uVar29 = (ushort)uVar30;
              bVar26 = (bool)((byte)uVar30 & 1);
              bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
              bVar12 = (bool)((byte)(uVar30 >> 8) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 9) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 0xb) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 0xc) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 0xd) & 1);
              bVar18 = (bool)((byte)(uVar30 >> 0xe) & 1);
              bVar19 = SUB81(uVar30 >> 0xf,0);
              *(uint *)local_a7c0 =
                   (uint)bVar26 * *(int *)local_a7c0 | (uint)!bVar26 * local_a680._0_4_;
              *(uint *)(local_a7c0 + 4) =
                   (uint)bVar4 * *(int *)(local_a7c0 + 4) | (uint)!bVar4 * local_a680._4_4_;
              *(uint *)(local_a7c0 + 8) =
                   (uint)bVar5 * *(int *)(local_a7c0 + 8) | (uint)!bVar5 * local_a680._8_4_;
              *(uint *)(local_a7c0 + 0xc) =
                   (uint)bVar6 * *(int *)(local_a7c0 + 0xc) | (uint)!bVar6 * local_a680._12_4_;
              *(uint *)(local_a7c0 + 0x10) =
                   (uint)bVar7 * *(int *)(local_a7c0 + 0x10) | (uint)!bVar7 * local_a680._16_4_;
              *(uint *)(local_a7c0 + 0x14) =
                   (uint)bVar8 * *(int *)(local_a7c0 + 0x14) | (uint)!bVar8 * local_a680._20_4_;
              *(uint *)(local_a7c0 + 0x18) =
                   (uint)bVar9 * *(int *)(local_a7c0 + 0x18) | (uint)!bVar9 * local_a680._24_4_;
              *(uint *)(local_a7c0 + 0x1c) =
                   (uint)bVar10 * *(int *)(local_a7c0 + 0x1c) | (uint)!bVar10 * local_a680._28_4_;
              *(uint *)(local_a7c0 + 0x20) =
                   (uint)bVar12 * *(int *)(local_a7c0 + 0x20) | (uint)!bVar12 * local_a680._32_4_;
              *(uint *)(local_a7c0 + 0x24) =
                   (uint)bVar13 * *(int *)(local_a7c0 + 0x24) | (uint)!bVar13 * local_a680._36_4_;
              *(uint *)(local_a7c0 + 0x28) =
                   (uint)bVar14 * *(int *)(local_a7c0 + 0x28) | (uint)!bVar14 * local_a680._40_4_;
              *(uint *)(local_a7c0 + 0x2c) =
                   (uint)bVar15 * *(int *)(local_a7c0 + 0x2c) | (uint)!bVar15 * local_a680._44_4_;
              *(uint *)(local_a7c0 + 0x30) =
                   (uint)bVar16 * *(int *)(local_a7c0 + 0x30) | (uint)!bVar16 * local_a680._48_4_;
              *(uint *)(local_a7c0 + 0x34) =
                   (uint)bVar17 * *(int *)(local_a7c0 + 0x34) | (uint)!bVar17 * local_a680._52_4_;
              *(uint *)(local_a7c0 + 0x38) =
                   (uint)bVar18 * *(int *)(local_a7c0 + 0x38) | (uint)!bVar18 * local_a680._56_4_;
              *(uint *)(local_a7c0 + 0x3c) =
                   (uint)bVar19 * *(int *)(local_a7c0 + 0x3c) | (uint)!bVar19 * local_a680._60_4_;
            }
            uVar28 = uVar28 & (ushort)~uVar29;
          }
        }
      }
      uVar29 = (ushort)uVar28;
      if (uVar29 == 0) {
LAB_0081f400:
        uVar29 = 0;
        break;
      }
      auVar40 = *(undefined1 (*) [64])ray;
      auVar46 = *(undefined1 (*) [64])(ray + 0x40);
      auVar57 = *(undefined1 (*) [64])(ray + 0x80);
      auVar47 = *(undefined1 (*) [64])(ray + 0x100);
      auVar48 = *(undefined1 (*) [64])(ray + 0x140);
      auVar49 = *(undefined1 (*) [64])(ray + 0x180);
      auVar50 = vsubps_avx512f(local_9f40,auVar40);
      auVar51 = vsubps_avx512f(local_9f80,auVar46);
      auVar52 = vsubps_avx512f(local_9fc0,auVar57);
      auVar53 = vsubps_avx512f(local_a000,auVar40);
      auVar54 = vsubps_avx512f(local_a040,auVar46);
      auVar55 = vsubps_avx512f(local_a080,auVar57);
      auVar56 = vsubps_avx512f(local_a6c0,auVar40);
      auVar46 = vsubps_avx512f(local_9ec0,auVar46);
      auVar57 = vsubps_avx512f(local_9f00,auVar57);
      auVar58 = vsubps_avx512f(auVar56,auVar50);
      auVar59 = vsubps_avx512f(auVar46,auVar51);
      auVar60 = vsubps_avx512f(auVar57,auVar52);
      auVar61 = vsubps_avx512f(auVar50,auVar53);
      auVar62 = vsubps_avx512f(auVar51,auVar54);
      auVar63 = vsubps_avx512f(auVar52,auVar55);
      auVar64 = vsubps_avx512f(auVar53,auVar56);
      auVar65 = vsubps_avx512f(auVar54,auVar46);
      auVar66 = vsubps_avx512f(auVar55,auVar57);
      auVar40 = vaddps_avx512f(auVar56,auVar50);
      auVar67 = vaddps_avx512f(auVar46,auVar51);
      auVar68 = vaddps_avx512f(auVar57,auVar52);
      auVar69 = vmulps_avx512f(auVar67,auVar60);
      auVar69 = vfmsub231ps_avx512f(auVar69,auVar59,auVar68);
      auVar68 = vmulps_avx512f(auVar68,auVar58);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar60,auVar40);
      auVar40 = vmulps_avx512f(auVar40,auVar59);
      auVar40 = vfmsub231ps_avx512f(auVar40,auVar58,auVar67);
      auVar40 = vmulps_avx512f(auVar40,auVar49);
      auVar40 = vfmadd231ps_avx512f(auVar40,auVar48,auVar68);
      auVar67 = vfmadd231ps_avx512f(auVar40,auVar47,auVar69);
      auVar40 = vaddps_avx512f(auVar50,auVar53);
      auVar68 = vaddps_avx512f(auVar51,auVar54);
      auVar69 = vaddps_avx512f(auVar52,auVar55);
      auVar70 = vmulps_avx512f(auVar68,auVar63);
      auVar70 = vfmsub231ps_avx512f(auVar70,auVar62,auVar69);
      auVar69 = vmulps_avx512f(auVar69,auVar61);
      auVar69 = vfmsub231ps_avx512f(auVar69,auVar63,auVar40);
      auVar40 = vmulps_avx512f(auVar40,auVar62);
      auVar40 = vfmsub231ps_avx512f(auVar40,auVar61,auVar68);
      auVar40 = vmulps_avx512f(auVar40,auVar49);
      auVar40 = vfmadd231ps_avx512f(auVar40,auVar48,auVar69);
      auVar68 = vfmadd231ps_avx512f(auVar40,auVar47,auVar70);
      auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar53 = vaddps_avx512f(auVar53,auVar56);
      auVar46 = vaddps_avx512f(auVar54,auVar46);
      auVar57 = vaddps_avx512f(auVar55,auVar57);
      auVar54 = vmulps_avx512f(auVar46,auVar66);
      auVar54 = vfmsub231ps_avx512f(auVar54,auVar65,auVar57);
      auVar57 = vmulps_avx512f(auVar57,auVar64);
      auVar57 = vfmsub231ps_avx512f(auVar57,auVar66,auVar53);
      auVar53 = vmulps_avx512f(auVar53,auVar65);
      auVar46 = vfmsub231ps_avx512f(auVar53,auVar64,auVar46);
      auVar46 = vmulps_avx512f(auVar46,auVar49);
      auVar46 = vfmadd231ps_avx512f(auVar46,auVar48,auVar57);
      auVar46 = vfmadd231ps_avx512f(auVar46,auVar47,auVar54);
      auVar57 = vaddps_avx512f(auVar67,auVar68);
      auVar57 = vaddps_avx512f(auVar46,auVar57);
      auVar53 = vandps_avx512dq(auVar57,auVar41);
      auVar54 = vmulps_avx512f(auVar53,auVar86);
      auVar55 = vminps_avx512f(auVar67,auVar68);
      auVar55 = vminps_avx512f(auVar55,auVar46);
      auVar56 = vxorps_avx512dq(auVar54,auVar40);
      uVar22 = vcmpps_avx512f(auVar55,auVar56,5);
      auVar55 = vmaxps_avx512f(auVar67,auVar68);
      auVar46 = vmaxps_avx512f(auVar55,auVar46);
      uVar23 = vcmpps_avx512f(auVar46,auVar54,2);
      uVar27 = ((ushort)uVar22 | (ushort)uVar23) & uVar29;
      if (uVar27 != 0) {
        auVar46 = vmulps_avx512f(auVar62,auVar60);
        auVar54 = vmulps_avx512f(auVar58,auVar63);
        auVar55 = vmulps_avx512f(auVar61,auVar59);
        auVar56 = vmulps_avx512f(auVar65,auVar63);
        auVar69 = vmulps_avx512f(auVar61,auVar66);
        auVar70 = vmulps_avx512f(auVar64,auVar62);
        auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar46);
        auVar60 = vfmsub213ps_avx512f(auVar60,auVar61,auVar54);
        auVar58 = vfmsub213ps_avx512f(auVar58,auVar62,auVar55);
        auVar62 = vfmsub213ps_avx512f(auVar66,auVar62,auVar56);
        auVar63 = vfmsub213ps_avx512f(auVar64,auVar63,auVar69);
        auVar61 = vfmsub213ps_avx512f(auVar65,auVar61,auVar70);
        auVar46 = vandps_avx512dq(auVar46,auVar41);
        auVar56 = vandps_avx512dq(auVar56,auVar41);
        uVar30 = vcmpps_avx512f(auVar46,auVar56,1);
        auVar46 = vandps_avx512dq(auVar54,auVar41);
        auVar54 = vandps_avx512dq(auVar69,auVar41);
        uVar20 = vcmpps_avx512f(auVar46,auVar54,1);
        auVar46 = vandps_avx512dq(auVar55,auVar41);
        auVar54 = vandps_avx512dq(auVar70,auVar41);
        uVar21 = vcmpps_avx512f(auVar46,auVar54,1);
        bVar26 = (bool)((byte)uVar30 & 1);
        auVar64._0_4_ = (uint)bVar26 * auVar59._0_4_ | (uint)!bVar26 * auVar62._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar26 * auVar59._4_4_ | (uint)!bVar26 * auVar62._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar26 * auVar59._8_4_ | (uint)!bVar26 * auVar62._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar64._12_4_ = (uint)bVar26 * auVar59._12_4_ | (uint)!bVar26 * auVar62._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar64._16_4_ = (uint)bVar26 * auVar59._16_4_ | (uint)!bVar26 * auVar62._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar64._20_4_ = (uint)bVar26 * auVar59._20_4_ | (uint)!bVar26 * auVar62._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar64._24_4_ = (uint)bVar26 * auVar59._24_4_ | (uint)!bVar26 * auVar62._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar64._28_4_ = (uint)bVar26 * auVar59._28_4_ | (uint)!bVar26 * auVar62._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar64._32_4_ = (uint)bVar26 * auVar59._32_4_ | (uint)!bVar26 * auVar62._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar64._36_4_ = (uint)bVar26 * auVar59._36_4_ | (uint)!bVar26 * auVar62._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar64._40_4_ = (uint)bVar26 * auVar59._40_4_ | (uint)!bVar26 * auVar62._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar64._44_4_ = (uint)bVar26 * auVar59._44_4_ | (uint)!bVar26 * auVar62._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar64._48_4_ = (uint)bVar26 * auVar59._48_4_ | (uint)!bVar26 * auVar62._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar64._52_4_ = (uint)bVar26 * auVar59._52_4_ | (uint)!bVar26 * auVar62._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar64._56_4_ = (uint)bVar26 * auVar59._56_4_ | (uint)!bVar26 * auVar62._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        auVar64._60_4_ = (uint)bVar26 * auVar59._60_4_ | (uint)!bVar26 * auVar62._60_4_;
        bVar26 = (bool)((byte)uVar20 & 1);
        auVar39._0_4_ = (uint)bVar26 * auVar60._0_4_ | (uint)!bVar26 * auVar63._0_4_;
        bVar26 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar26 * auVar60._4_4_ | (uint)!bVar26 * auVar63._4_4_;
        bVar26 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar26 * auVar60._8_4_ | (uint)!bVar26 * auVar63._8_4_;
        bVar26 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar26 * auVar60._12_4_ | (uint)!bVar26 * auVar63._12_4_;
        bVar26 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar26 * auVar60._16_4_ | (uint)!bVar26 * auVar63._16_4_;
        bVar26 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar26 * auVar60._20_4_ | (uint)!bVar26 * auVar63._20_4_;
        bVar26 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar26 * auVar60._24_4_ | (uint)!bVar26 * auVar63._24_4_;
        bVar26 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar39._28_4_ = (uint)bVar26 * auVar60._28_4_ | (uint)!bVar26 * auVar63._28_4_;
        bVar26 = (bool)((byte)(uVar20 >> 8) & 1);
        auVar59._32_4_ = (uint)bVar26 * auVar60._32_4_ | (uint)!bVar26 * auVar63._32_4_;
        auVar59._0_32_ = auVar39;
        bVar26 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar59._36_4_ = (uint)bVar26 * auVar60._36_4_ | (uint)!bVar26 * auVar63._36_4_;
        bVar26 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar59._40_4_ = (uint)bVar26 * auVar60._40_4_ | (uint)!bVar26 * auVar63._40_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar59._44_4_ = (uint)bVar26 * auVar60._44_4_ | (uint)!bVar26 * auVar63._44_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar59._48_4_ = (uint)bVar26 * auVar60._48_4_ | (uint)!bVar26 * auVar63._48_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar59._52_4_ = (uint)bVar26 * auVar60._52_4_ | (uint)!bVar26 * auVar63._52_4_;
        bVar26 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar59._56_4_ = (uint)bVar26 * auVar60._56_4_ | (uint)!bVar26 * auVar63._56_4_;
        bVar26 = SUB81(uVar20 >> 0xf,0);
        auVar59._60_4_ = (uint)bVar26 * auVar60._60_4_ | (uint)!bVar26 * auVar63._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        auVar60._0_4_ = (uint)bVar26 * auVar58._0_4_ | (uint)!bVar26 * auVar61._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar26 * auVar58._4_4_ | (uint)!bVar26 * auVar61._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar26 * auVar58._8_4_ | (uint)!bVar26 * auVar61._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar26 * auVar58._12_4_ | (uint)!bVar26 * auVar61._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar60._16_4_ = (uint)bVar26 * auVar58._16_4_ | (uint)!bVar26 * auVar61._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar60._20_4_ = (uint)bVar26 * auVar58._20_4_ | (uint)!bVar26 * auVar61._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar60._24_4_ = (uint)bVar26 * auVar58._24_4_ | (uint)!bVar26 * auVar61._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar60._28_4_ = (uint)bVar26 * auVar58._28_4_ | (uint)!bVar26 * auVar61._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        auVar60._32_4_ = (uint)bVar26 * auVar58._32_4_ | (uint)!bVar26 * auVar61._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        auVar60._36_4_ = (uint)bVar26 * auVar58._36_4_ | (uint)!bVar26 * auVar61._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        auVar60._40_4_ = (uint)bVar26 * auVar58._40_4_ | (uint)!bVar26 * auVar61._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        auVar60._44_4_ = (uint)bVar26 * auVar58._44_4_ | (uint)!bVar26 * auVar61._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        auVar60._48_4_ = (uint)bVar26 * auVar58._48_4_ | (uint)!bVar26 * auVar61._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        auVar60._52_4_ = (uint)bVar26 * auVar58._52_4_ | (uint)!bVar26 * auVar61._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        auVar60._56_4_ = (uint)bVar26 * auVar58._56_4_ | (uint)!bVar26 * auVar61._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        auVar60._60_4_ = (uint)bVar26 * auVar58._60_4_ | (uint)!bVar26 * auVar61._60_4_;
        auVar46 = vmulps_avx512f(auVar49,auVar60);
        auVar46 = vfmadd213ps_avx512f(auVar48,auVar59,auVar46);
        auVar46 = vfmadd213ps_avx512f(auVar47,auVar64,auVar46);
        auVar47 = vaddps_avx512f(auVar46,auVar46);
        auVar46 = vmulps_avx512f(auVar52,auVar60);
        auVar46 = vfmadd213ps_avx512f(auVar51,auVar59,auVar46);
        auVar46 = vfmadd213ps_avx512f(auVar50,auVar64,auVar46);
        auVar48 = vrcp14ps_avx512f(auVar47);
        auVar46 = vaddps_avx512f(auVar46,auVar46);
        auVar49 = vfnmadd213ps_avx512f(auVar48,auVar47,auVar43);
        auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,auVar48);
        auVar48 = vmulps_avx512f(auVar46,auVar48);
        auVar46 = *(undefined1 (*) [64])(ray + 0x200);
        uVar22 = vcmpps_avx512f(auVar48,auVar46,2);
        uVar23 = vcmpps_avx512f(auVar48,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar25 = vcmpps_avx512f(auVar47,_DAT_01ff2200,4);
        uVar27 = uVar27 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar25;
        if (uVar27 != 0) {
          pGVar1 = (context->scene->geometries).items[*(uint *)(lVar31 + lVar34 * 4)].ptr;
          auVar47 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
          uVar22 = vptestmd_avx512f(auVar47,*(undefined1 (*) [64])(ray + 0x240));
          uVar27 = uVar27 & (ushort)uVar22;
          if (uVar27 != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              lVar31 = local_a740._0_8_;
            }
            else {
              auVar47 = vrcp14ps_avx512f(auVar57);
              auVar49._8_4_ = 0x219392ef;
              auVar49._0_8_ = 0x219392ef219392ef;
              auVar49._12_4_ = 0x219392ef;
              auVar49._16_4_ = 0x219392ef;
              auVar49._20_4_ = 0x219392ef;
              auVar49._24_4_ = 0x219392ef;
              auVar49._28_4_ = 0x219392ef;
              auVar49._32_4_ = 0x219392ef;
              auVar49._36_4_ = 0x219392ef;
              auVar49._40_4_ = 0x219392ef;
              auVar49._44_4_ = 0x219392ef;
              auVar49._48_4_ = 0x219392ef;
              auVar49._52_4_ = 0x219392ef;
              auVar49._56_4_ = 0x219392ef;
              auVar49._60_4_ = 0x219392ef;
              uVar30 = vcmpps_avx512f(auVar53,auVar49,5);
              auVar57 = vfnmadd213ps_avx512f(auVar57,auVar47,auVar43);
              auVar57 = vfmadd132ps_avx512f(auVar57,auVar47,auVar47);
              auVar51._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar57._4_4_;
              auVar51._0_4_ = (uint)((byte)uVar30 & 1) * auVar57._0_4_;
              auVar51._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar57._8_4_;
              auVar51._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar57._12_4_;
              auVar51._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar57._16_4_;
              auVar51._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar57._20_4_;
              auVar51._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar57._24_4_;
              auVar51._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar57._28_4_;
              auVar51._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar57._32_4_;
              auVar51._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar57._36_4_;
              auVar51._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar57._40_4_;
              auVar51._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar57._44_4_;
              auVar51._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar57._48_4_;
              auVar51._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar57._52_4_;
              auVar51._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar57._56_4_;
              auVar51._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar57._60_4_;
              auVar57 = vmulps_avx512f(auVar67,auVar51);
              auVar57 = vminps_avx512f(auVar57,auVar43);
              auVar47 = vmulps_avx512f(auVar68,auVar51);
              auVar47 = vminps_avx512f(auVar47,auVar43);
              local_a580 = vsubps_avx512f(auVar43,auVar57);
              local_a540 = vsubps_avx512f(auVar43,auVar47);
              pRVar2 = context->user;
              auVar57 = vpbroadcastd_avx512f();
              auVar47 = vpbroadcastd_avx512f();
              local_a500 = vmovdqa64_avx512f(auVar47);
              local_a4c0 = vmovdqa64_avx512f(auVar57);
              auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
              local_a7b0[3] = auVar39;
              local_a7b0[2] = auVar39;
              local_a7b0[1] = auVar39;
              *local_a7b0 = auVar39;
              local_a480 = vbroadcastss_avx512f(ZEXT416(pRVar2->instID[0]));
              local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar2->instPrimID[0]));
              auVar57 = vblendmps_avx512f(auVar46,auVar48);
              bVar26 = (bool)((byte)uVar27 & 1);
              bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar27 >> 7) & 1);
              bVar11 = (byte)(uVar27 >> 8);
              bVar12 = (bool)(bVar11 >> 1 & 1);
              bVar13 = (bool)(bVar11 >> 2 & 1);
              bVar14 = (bool)(bVar11 >> 3 & 1);
              bVar15 = (bool)(bVar11 >> 4 & 1);
              bVar16 = (bool)(bVar11 >> 5 & 1);
              bVar17 = (bool)(bVar11 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar26 * auVar57._0_4_ | (uint)!bVar26 * local_a440._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar4 * auVar57._4_4_ | (uint)!bVar4 * local_a440._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar5 * auVar57._8_4_ | (uint)!bVar5 * local_a440._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar6 * auVar57._12_4_ | (uint)!bVar6 * local_a440._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar7 * auVar57._16_4_ | (uint)!bVar7 * local_a440._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar8 * auVar57._20_4_ | (uint)!bVar8 * local_a440._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * local_a440._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar10 * auVar57._28_4_ | (uint)!bVar10 * local_a440._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar11 & 1) * auVar57._32_4_ |
                   (uint)!(bool)(bVar11 & 1) * local_a440._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar12 * auVar57._36_4_ | (uint)!bVar12 * local_a440._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar13 * auVar57._40_4_ | (uint)!bVar13 * local_a440._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar14 * auVar57._44_4_ | (uint)!bVar14 * local_a440._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar15 * auVar57._48_4_ | (uint)!bVar15 * local_a440._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar16 * auVar57._52_4_ | (uint)!bVar16 * local_a440._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar17 * auVar57._56_4_ | (uint)!bVar17 * local_a440._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar27 >> 0xf) * auVar57._60_4_ |
                   (uint)!(bool)(bVar11 >> 7) * local_a440._60_4_;
              auVar57 = vpmovm2d_avx512dq((ulong)uVar27);
              local_a700 = vmovdqa64_avx512f(auVar57);
              local_a7a8.valid = (int *)local_a700;
              local_a7a8.geometryUserPtr = pGVar1->userPtr;
              local_a7a8.context = context->user;
              local_a7a8.hit = local_a640;
              local_a7a8.N = 0x10;
              local_a7a8.ray = (RTCRayN *)ray;
              local_a6c0 = auVar46;
              local_a640 = (RTCHitN  [64])auVar64;
              local_a600 = auVar59;
              local_a5c0 = auVar60;
              if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar1->occlusionFilterN)(&local_a7a8);
                auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar57 = vmovdqa64_avx512f(local_a700);
                ray = local_a7d8;
                uVar37 = local_a7d0;
                context = local_a7c8;
              }
              uVar22 = vptestmd_avx512f(auVar57,auVar57);
              if ((short)uVar22 == 0) {
                uVar30 = 0;
                lVar31 = local_a740._0_8_;
              }
              else {
                p_Var3 = context->args->filter;
                if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar1->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var3)(&local_a7a8);
                  auVar40 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                  auVar86 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar41 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar57 = vmovdqa64_avx512f(local_a700);
                  ray = local_a7d8;
                  uVar37 = local_a7d0;
                  context = local_a7c8;
                }
                uVar30 = vptestmd_avx512f(auVar57,auVar57);
                auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar26 = (bool)((byte)uVar30 & 1);
                bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar30 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar30 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar30 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar30 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar30 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar30 >> 0xe) & 1);
                bVar19 = SUB81(uVar30 >> 0xf,0);
                *(uint *)(local_a7a8.ray + 0x200) =
                     (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * *(int *)(local_a7a8.ray + 0x200)
                ;
                *(uint *)(local_a7a8.ray + 0x204) =
                     (uint)bVar4 * auVar46._4_4_ | (uint)!bVar4 * *(int *)(local_a7a8.ray + 0x204);
                *(uint *)(local_a7a8.ray + 0x208) =
                     (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * *(int *)(local_a7a8.ray + 0x208);
                *(uint *)(local_a7a8.ray + 0x20c) =
                     (uint)bVar6 * auVar46._12_4_ | (uint)!bVar6 * *(int *)(local_a7a8.ray + 0x20c);
                *(uint *)(local_a7a8.ray + 0x210) =
                     (uint)bVar7 * auVar46._16_4_ | (uint)!bVar7 * *(int *)(local_a7a8.ray + 0x210);
                *(uint *)(local_a7a8.ray + 0x214) =
                     (uint)bVar8 * auVar46._20_4_ | (uint)!bVar8 * *(int *)(local_a7a8.ray + 0x214);
                *(uint *)(local_a7a8.ray + 0x218) =
                     (uint)bVar9 * auVar46._24_4_ | (uint)!bVar9 * *(int *)(local_a7a8.ray + 0x218);
                *(uint *)(local_a7a8.ray + 0x21c) =
                     (uint)bVar10 * auVar46._28_4_ |
                     (uint)!bVar10 * *(int *)(local_a7a8.ray + 0x21c);
                *(uint *)(local_a7a8.ray + 0x220) =
                     (uint)bVar12 * auVar46._32_4_ |
                     (uint)!bVar12 * *(int *)(local_a7a8.ray + 0x220);
                *(uint *)(local_a7a8.ray + 0x224) =
                     (uint)bVar13 * auVar46._36_4_ |
                     (uint)!bVar13 * *(int *)(local_a7a8.ray + 0x224);
                *(uint *)(local_a7a8.ray + 0x228) =
                     (uint)bVar14 * auVar46._40_4_ |
                     (uint)!bVar14 * *(int *)(local_a7a8.ray + 0x228);
                *(uint *)(local_a7a8.ray + 0x22c) =
                     (uint)bVar15 * auVar46._44_4_ |
                     (uint)!bVar15 * *(int *)(local_a7a8.ray + 0x22c);
                *(uint *)(local_a7a8.ray + 0x230) =
                     (uint)bVar16 * auVar46._48_4_ |
                     (uint)!bVar16 * *(int *)(local_a7a8.ray + 0x230);
                *(uint *)(local_a7a8.ray + 0x234) =
                     (uint)bVar17 * auVar46._52_4_ |
                     (uint)!bVar17 * *(int *)(local_a7a8.ray + 0x234);
                *(uint *)(local_a7a8.ray + 0x238) =
                     (uint)bVar18 * auVar46._56_4_ |
                     (uint)!bVar18 * *(int *)(local_a7a8.ray + 0x238);
                *(uint *)(local_a7a8.ray + 0x23c) =
                     (uint)bVar19 * auVar46._60_4_ |
                     (uint)!bVar19 * *(int *)(local_a7a8.ray + 0x23c);
                lVar31 = local_a740._0_8_;
              }
              uVar27 = (ushort)uVar30;
              bVar26 = (bool)((byte)uVar30 & 1);
              bVar4 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
              bVar12 = (bool)((byte)(uVar30 >> 8) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 9) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 10) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 0xb) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 0xc) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 0xd) & 1);
              bVar18 = (bool)((byte)(uVar30 >> 0xe) & 1);
              bVar19 = SUB81(uVar30 >> 0xf,0);
              *(uint *)local_a7c0 =
                   (uint)bVar26 * *(int *)local_a7c0 | (uint)!bVar26 * local_a6c0._0_4_;
              *(uint *)(local_a7c0 + 4) =
                   (uint)bVar4 * *(int *)(local_a7c0 + 4) | (uint)!bVar4 * local_a6c0._4_4_;
              *(uint *)(local_a7c0 + 8) =
                   (uint)bVar5 * *(int *)(local_a7c0 + 8) | (uint)!bVar5 * local_a6c0._8_4_;
              *(uint *)(local_a7c0 + 0xc) =
                   (uint)bVar6 * *(int *)(local_a7c0 + 0xc) | (uint)!bVar6 * local_a6c0._12_4_;
              *(uint *)(local_a7c0 + 0x10) =
                   (uint)bVar7 * *(int *)(local_a7c0 + 0x10) | (uint)!bVar7 * local_a6c0._16_4_;
              *(uint *)(local_a7c0 + 0x14) =
                   (uint)bVar8 * *(int *)(local_a7c0 + 0x14) | (uint)!bVar8 * local_a6c0._20_4_;
              *(uint *)(local_a7c0 + 0x18) =
                   (uint)bVar9 * *(int *)(local_a7c0 + 0x18) | (uint)!bVar9 * local_a6c0._24_4_;
              *(uint *)(local_a7c0 + 0x1c) =
                   (uint)bVar10 * *(int *)(local_a7c0 + 0x1c) | (uint)!bVar10 * local_a6c0._28_4_;
              *(uint *)(local_a7c0 + 0x20) =
                   (uint)bVar12 * *(int *)(local_a7c0 + 0x20) | (uint)!bVar12 * local_a6c0._32_4_;
              *(uint *)(local_a7c0 + 0x24) =
                   (uint)bVar13 * *(int *)(local_a7c0 + 0x24) | (uint)!bVar13 * local_a6c0._36_4_;
              *(uint *)(local_a7c0 + 0x28) =
                   (uint)bVar14 * *(int *)(local_a7c0 + 0x28) | (uint)!bVar14 * local_a6c0._40_4_;
              *(uint *)(local_a7c0 + 0x2c) =
                   (uint)bVar15 * *(int *)(local_a7c0 + 0x2c) | (uint)!bVar15 * local_a6c0._44_4_;
              *(uint *)(local_a7c0 + 0x30) =
                   (uint)bVar16 * *(int *)(local_a7c0 + 0x30) | (uint)!bVar16 * local_a6c0._48_4_;
              *(uint *)(local_a7c0 + 0x34) =
                   (uint)bVar17 * *(int *)(local_a7c0 + 0x34) | (uint)!bVar17 * local_a6c0._52_4_;
              *(uint *)(local_a7c0 + 0x38) =
                   (uint)bVar18 * *(int *)(local_a7c0 + 0x38) | (uint)!bVar18 * local_a6c0._56_4_;
              *(uint *)(local_a7c0 + 0x3c) =
                   (uint)bVar19 * *(int *)(local_a7c0 + 0x3c) | (uint)!bVar19 * local_a6c0._60_4_;
            }
            uVar28 = (uint)(uVar29 & ~uVar27);
            if ((uVar29 & ~uVar27) == 0) goto LAB_0081f400;
          }
        }
      }
      uVar29 = (ushort)uVar28;
      lVar34 = lVar34 + 1;
    } while (lVar34 != 4);
    uVar29 = (ushort)local_a7b4 & uVar29;
    uVar28 = CONCAT22((short)(local_a7b4 >> 0x10),uVar29);
    if (uVar29 == 0) break;
  }
  uVar28 = ~uVar28;
LAB_0081f42f:
  uVar36 = uVar36 | uVar28;
  if ((short)uVar36 == -1) {
    uVar36 = 0xffff;
    goto LAB_0081f569;
  }
  auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar26 = (bool)((byte)uVar36 & 1);
  local_a0c0 = (uint)bVar26 * auVar46._0_4_ | !bVar26 * local_a0c0;
  bVar26 = (bool)((byte)(uVar36 >> 1) & 1);
  uStack_a0bc = (uint)bVar26 * auVar46._4_4_ | !bVar26 * uStack_a0bc;
  bVar26 = (bool)((byte)(uVar36 >> 2) & 1);
  uStack_a0b8 = (uint)bVar26 * auVar46._8_4_ | !bVar26 * uStack_a0b8;
  bVar26 = (bool)((byte)(uVar36 >> 3) & 1);
  uStack_a0b4 = (uint)bVar26 * auVar46._12_4_ | !bVar26 * uStack_a0b4;
  bVar26 = (bool)((byte)(uVar36 >> 4) & 1);
  uStack_a0b0 = (uint)bVar26 * auVar46._16_4_ | !bVar26 * uStack_a0b0;
  bVar26 = (bool)((byte)(uVar36 >> 5) & 1);
  uStack_a0ac = (uint)bVar26 * auVar46._20_4_ | !bVar26 * uStack_a0ac;
  bVar26 = (bool)((byte)(uVar36 >> 6) & 1);
  uStack_a0a8 = (uint)bVar26 * auVar46._24_4_ | !bVar26 * uStack_a0a8;
  bVar26 = (bool)((byte)(uVar36 >> 7) & 1);
  uStack_a0a4 = (uint)bVar26 * auVar46._28_4_ | !bVar26 * uStack_a0a4;
  bVar26 = (bool)((byte)(uVar36 >> 8) & 1);
  uStack_a0a0 = (uint)bVar26 * auVar46._32_4_ | !bVar26 * uStack_a0a0;
  bVar26 = (bool)((byte)(uVar36 >> 9) & 1);
  uStack_a09c = (uint)bVar26 * auVar46._36_4_ | !bVar26 * uStack_a09c;
  bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
  uStack_a098 = (uint)bVar26 * auVar46._40_4_ | !bVar26 * uStack_a098;
  bVar26 = (bool)((byte)(uVar36 >> 0xb) & 1);
  uStack_a094 = (uint)bVar26 * auVar46._44_4_ | !bVar26 * uStack_a094;
  bVar26 = (bool)((byte)(uVar36 >> 0xc) & 1);
  uStack_a090 = (uint)bVar26 * auVar46._48_4_ | !bVar26 * uStack_a090;
  bVar26 = (bool)((byte)(uVar36 >> 0xd) & 1);
  uStack_a08c = (uint)bVar26 * auVar46._52_4_ | !bVar26 * uStack_a08c;
  bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
  uStack_a088 = (uint)bVar26 * auVar46._56_4_ | !bVar26 * uStack_a088;
  bVar26 = (bool)((byte)(uVar36 >> 0xf) & 1);
  uStack_a084 = (uint)bVar26 * auVar46._60_4_ | !bVar26 * uStack_a084;
  goto LAB_0081e457;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }